

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::MergeUpdateInfo<duckdb::interval_t>(UpdateInfo *current,interval_t *result_data)

{
  interval_t *piVar1;
  undefined8 uVar2;
  int64_t iVar3;
  undefined8 *__src;
  idx_t i;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = current->N;
  __src = (undefined8 *)((long)&current[1].segment + (ulong)current->max * 4);
  if (uVar5 == 0x800) {
    switchD_00917c1c::default(result_data,__src,0x8000);
    return;
  }
  for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
    uVar2 = *__src;
    iVar3 = __src[1];
    piVar1 = result_data + *(uint *)((long)&current[1].segment + uVar4 * 4);
    piVar1->months = (int)uVar2;
    piVar1->days = (int)((ulong)uVar2 >> 0x20);
    piVar1->micros = iVar3;
    uVar5 = current->N;
    __src = __src + 2;
  }
  return;
}

Assistant:

static void MergeUpdateInfo(UpdateInfo &current, T *result_data) {
	auto tuples = current.GetTuples();
	auto info_data = current.GetData<T>();
	if (current.N == STANDARD_VECTOR_SIZE) {
		// special case: update touches ALL tuples of this vector
		// in this case we can just memcpy the data
		// since the layout of the update info is guaranteed to be [0, 1, 2, 3, ...]
		memcpy(result_data, info_data, sizeof(T) * current.N);
	} else {
		for (idx_t i = 0; i < current.N; i++) {
			result_data[tuples[i]] = info_data[i];
		}
	}
}